

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_softmaxnd(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3b6) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b6;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    SoftmaxNDLayerParams::SoftmaxNDLayerParams(this_00.softmaxnd_);
    (this->layer_).softmaxnd_ = (SoftmaxNDLayerParams *)this_00;
  }
  return (SoftmaxNDLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxNDLayerParams* NeuralNetworkLayer::mutable_softmaxnd() {
  if (!has_softmaxnd()) {
    clear_layer();
    set_has_softmaxnd();
    layer_.softmaxnd_ = new ::CoreML::Specification::SoftmaxNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.softmaxND)
  return layer_.softmaxnd_;
}